

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

quatf tinyusdz::to_quaternion(float3 *axis,float angle)

{
  float fVar1;
  quatf qVar2;
  const_reference pvVar3;
  reference pvVar4;
  float fVar5;
  double dVar6;
  float c;
  float s;
  float angle_local;
  float3 *axis_local;
  quatf q;
  
  dVar6 = math::sin_pi(((double)angle * 0.5) / 180.0);
  fVar5 = (float)dVar6;
  dVar6 = math::cos_pi(((double)angle * 0.5) / 180.0);
  pvVar3 = ::std::array<float,_3UL>::operator[](axis,0);
  fVar1 = *pvVar3;
  pvVar4 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&axis_local,0);
  *pvVar4 = fVar1 * fVar5;
  pvVar3 = ::std::array<float,_3UL>::operator[](axis,1);
  fVar1 = *pvVar3;
  pvVar4 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&axis_local,1);
  *pvVar4 = fVar1 * fVar5;
  pvVar3 = ::std::array<float,_3UL>::operator[](axis,2);
  fVar1 = *pvVar3;
  pvVar4 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&axis_local,2);
  *pvVar4 = fVar1 * fVar5;
  qVar2.real = (float)dVar6;
  qVar2.imag._M_elems[0] = axis_local._0_4_;
  qVar2.imag._M_elems[1] = axis_local._4_4_;
  qVar2.imag._M_elems[2] = q.imag._M_elems[0];
  return qVar2;
}

Assistant:

value::quatf to_quaternion(const value::float3 &axis, const float angle) {

  // Use sin_pi and cos_pi for better accuracy.
  float s = float(math::sin_pi(double(angle)/2.0/180.0));
  float c = float(math::cos_pi(double(angle)/2.0/180.0));

  value::quatf q;
  q.imag[0] = axis[0] * s;
  q.imag[1] = axis[1] * s;
  q.imag[2] = axis[2] * s;
  q.real = c;

  return q;
}